

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O3

void WebRtcIsacBw_GetBandwidthInfo
               (BwEstimatorstr *bwest_str,IsacSamplingRate decoder_sample_rate_hz,
               IsacBandwidthInfo *bwinfo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if ((bwest_str->external_bw_info).in_use == 0) {
    bwinfo->in_use = 1;
    if ((bwest_str->external_bw_info).in_use == 0) {
      uVar1 = bwest_str->send_bw_avg;
      uVar2 = bwest_str->send_max_delay_avg;
      auVar5 = ZEXT816(0x190000dac0);
      auVar6._0_8_ = CONCAT44(-(uint)((int)(float)uVar2 < auVar5._4_4_),
                              -(uint)((int)(float)uVar1 < auVar5._0_4_));
      auVar6._8_8_ = 0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = CONCAT44((int)(float)uVar2,(int)(float)uVar1) & auVar6._0_8_;
      auVar4 = ~auVar6 & auVar5 | auVar4;
      uVar3 = CONCAT44(-(uint)(5 < auVar4._4_4_),-(uint)(10000 < auVar4._0_4_));
      uVar3 = ~uVar3 & 0x500002710 | auVar4._0_8_ & uVar3;
    }
    else {
      uVar3._0_4_ = (bwest_str->external_bw_info).send_bw_avg;
      uVar3._4_4_ = (bwest_str->external_bw_info).send_max_delay_avg;
    }
    bwinfo->send_bw_avg = (int)uVar3;
    bwinfo->send_max_delay_avg = (int)(uVar3 >> 0x20);
    WebRtcIsac_GetDownlinkBwJitIndexImpl
              (bwest_str,&bwinfo->bottleneck_idx,&bwinfo->jitter_info,decoder_sample_rate_hz);
    return;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0x30d,
                "void WebRtcIsacBw_GetBandwidthInfo(BwEstimatorstr *, enum IsacSamplingRate, IsacBandwidthInfo *)"
               );
}

Assistant:

void WebRtcIsacBw_GetBandwidthInfo(BwEstimatorstr* bwest_str,
                                   enum IsacSamplingRate decoder_sample_rate_hz,
                                   IsacBandwidthInfo* bwinfo) {
  assert(!bwest_str->external_bw_info.in_use);
  bwinfo->in_use = 1;
  bwinfo->send_bw_avg = WebRtcIsac_GetUplinkBandwidth(bwest_str);
  bwinfo->send_max_delay_avg = WebRtcIsac_GetUplinkMaxDelay(bwest_str);
  WebRtcIsac_GetDownlinkBwJitIndexImpl(bwest_str, &bwinfo->bottleneck_idx,
                                       &bwinfo->jitter_info,
                                       decoder_sample_rate_hz);
}